

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

void __thiscall
QSslConfiguration::setAllowedNextProtocols(QSslConfiguration *this,QList<QByteArray> *protocols)

{
  QList<QByteArray> *in_RSI;
  QList<QByteArray> *this_00;
  
  this_00 = in_RSI;
  QSharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QSharedDataPointer<QSslConfigurationPrivate> *)in_RSI);
  QList<QByteArray>::operator=(this_00,in_RSI);
  return;
}

Assistant:

void QSslConfiguration::setAllowedNextProtocols(const QList<QByteArray> &protocols)
{
    d->nextAllowedProtocols = protocols;
}